

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SliceParameter::Clear(SliceParameter *this)

{
  SliceParameter *this_local;
  
  google::protobuf::RepeatedField<unsigned_int>::Clear(&this->slice_point_);
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    this->slice_dim_ = 1;
    this->axis_ = 1;
  }
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void SliceParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.SliceParameter)
  slice_point_.Clear();
  if (_has_bits_[0 / 32] & 3u) {
    slice_dim_ = 1u;
    axis_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}